

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderConstExprTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::ShaderConstExprBuiltinTests::init
          (ShaderConstExprBuiltinTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  long lVar1;
  undefined **ppuVar2;
  undefined8 *puVar3;
  byte bVar4;
  TestParams cases [3];
  undefined1 local_418 [24];
  undefined1 *puStack_400;
  float local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *puStack_3d8;
  undefined4 local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *puStack_3b0;
  undefined4 local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *puStack_388;
  undefined4 local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *puStack_360;
  undefined4 local_358;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *puStack_338;
  undefined4 local_330;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *puStack_310;
  undefined4 local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *puStack_2e8;
  undefined4 local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *puStack_2c0;
  undefined4 local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *puStack_298;
  undefined4 local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *puStack_270;
  undefined4 local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *puStack_248;
  undefined4 local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *puStack_220;
  undefined4 local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *puStack_1f8;
  undefined4 local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *puStack_1d0;
  undefined4 local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *puStack_1a8;
  undefined4 local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined8 uStack_180;
  undefined4 local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *puStack_158;
  undefined4 local_150;
  char *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *puStack_130;
  undefined4 local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *puStack_108;
  undefined4 local_100;
  char *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  undefined1 *puStack_e0;
  undefined4 local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *puStack_b8;
  undefined4 local_b0;
  char *local_a8;
  char *local_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined4 local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *puStack_68;
  undefined4 local_60;
  char *local_58;
  char *local_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined4 local_38;
  
  bVar4 = 0;
  local_418._0_8_ = "radians";
  local_418._8_8_ = "radians(${T} (90.0))";
  local_418._16_8_ = &DAT_100000001;
  puStack_400 = (undefined1 *)0x100000004;
  local_3f8 = 1.5707964;
  local_3f0 = "degrees";
  local_3e8 = "degrees(${T} (2.0))";
  local_3e0 = &DAT_100000001;
  puStack_3d8 = (undefined1 *)0x100000004;
  local_3d0 = 0x42e52ee0;
  local_3c8 = "sin";
  local_3c0 = "sin(${T} (3.0))";
  local_3b8 = &DAT_100000001;
  puStack_3b0 = (undefined1 *)0x100000004;
  local_3a8 = 0x3e1081c3;
  local_3a0 = "cos";
  local_398 = "cos(${T} (3.2))";
  local_390 = &DAT_100000001;
  puStack_388 = (undefined1 *)0x100000004;
  local_380 = 0xbf7f903f;
  local_378 = "tan";
  local_370 = "tan(${T} (1.5))";
  local_368 = &DAT_100000001;
  puStack_360 = (undefined1 *)0x100000004;
  local_358 = 0x41619f6b;
  local_350 = "asin";
  local_348 = "asin(${T} (0.0))";
  local_340 = &DAT_100000001;
  puStack_338 = (undefined1 *)0x100000004;
  local_330 = 0;
  local_328 = "acos";
  local_320 = "acos(${T} (1.0))";
  local_318 = &DAT_100000001;
  puStack_310 = (undefined1 *)0x100000004;
  local_308 = 0;
  local_300 = "atan_separate";
  local_2f8 = "atan(${T} (-1.0), ${T} (-1.0))";
  local_2f0 = &DAT_100000001;
  puStack_2e8 = (undefined1 *)0x100000004;
  local_2e0 = 0xc016cbe4;
  local_2d8 = "atan_combined";
  local_2d0 = "atan(${T} (2.0))";
  local_2c8 = &DAT_100000001;
  puStack_2c0 = (undefined1 *)0x100000004;
  local_2b8 = 0x3f8db70d;
  addChildGroup(this,"trigonometry","Trigonometry",(TestParams *)local_418,9);
  local_418._0_8_ = "pow";
  local_418._8_8_ = "pow(${T} (1.7), ${T} (3.5))";
  local_418._16_8_ = &DAT_100000001;
  puStack_400 = (undefined1 *)0x100000004;
  local_3f8 = 6.405769;
  local_3f0 = "exp";
  local_3e8 = "exp(${T} (4.2))";
  local_3e0 = &DAT_100000001;
  puStack_3d8 = (undefined1 *)0x100000004;
  local_3d0 = 0x42855f65;
  local_3c8 = "log";
  local_3c0 = "log(${T} (42.12))";
  local_3b8 = &DAT_100000001;
  puStack_3b0 = (undefined1 *)0x100000004;
  local_3a8 = 0x406f64b9;
  local_3a0 = "exp2";
  local_398 = "exp2(${T} (6.7))";
  local_390 = &DAT_100000001;
  puStack_388 = (undefined1 *)0x100000004;
  local_380 = 0x42cfefc3;
  local_378 = "log2";
  local_370 = "log2(${T} (100.0))";
  local_368 = &DAT_100000001;
  puStack_360 = (undefined1 *)0x100000004;
  local_358 = 0x40d49a78;
  local_350 = "sqrt";
  local_348 = "sqrt(${T} (10.0))";
  local_340 = &DAT_100000001;
  puStack_338 = (undefined1 *)0x100000004;
  local_330 = 0x404a62c2;
  local_328 = "inversesqrt";
  local_320 = "inversesqrt(${T} (10.0))";
  local_318 = &DAT_100000001;
  puStack_310 = (undefined1 *)0x100000004;
  local_308 = 0x3ea1e89b;
  addChildGroup(this,"exponential","Exponential",(TestParams *)local_418,7);
  local_418._0_8_ = "abs";
  local_418._8_8_ = "abs(${T} (-42.0))";
  local_418._16_8_ = &DAT_100000001;
  puStack_400 = (undefined1 *)0x100000004;
  local_3f8 = 42.0;
  local_3f0 = "sign";
  local_3e8 = "sign(${T} (-18.0))";
  local_3e0 = &DAT_100000001;
  puStack_3d8 = (undefined1 *)0x100000004;
  local_3d0 = 0xbf800000;
  local_3c8 = "floor";
  local_3c0 = "floor(${T} (37.3))";
  local_3b8 = &DAT_100000001;
  puStack_3b0 = (undefined1 *)0x100000004;
  local_3a8 = 0x42140000;
  local_3a0 = "ceil";
  local_398 = "ceil(${T} (82.2))";
  local_390 = &DAT_100000001;
  puStack_388 = (undefined1 *)0x100000004;
  local_380 = 0x42a60000;
  local_378 = "fract";
  local_370 = "fract(${T} (17.75))";
  local_368 = &DAT_100000001;
  puStack_360 = (undefined1 *)0x100000004;
  local_358 = 0x3f400000;
  local_350 = "mod";
  local_348 = "mod(${T} (87.65), ${MT} (3.7))";
  local_340 = &DAT_100000001;
  puStack_338 = (undefined1 *)0x100000004;
  local_330 = 0x40233335;
  local_328 = "min";
  local_320 = "min(${T} (12.3), ${MT} (32.1))";
  local_318 = &DAT_100000001;
  puStack_310 = (undefined1 *)0x100000004;
  local_308 = 0x4144cccd;
  local_300 = "max";
  local_2f8 = "max(${T} (12.3), ${MT} (32.1))";
  local_2f0 = &DAT_100000001;
  puStack_2e8 = (undefined1 *)0x100000004;
  local_2e0 = 0x42006666;
  local_2d8 = "clamp";
  local_2d0 = "clamp(${T} (42.1),\t${MT} (10.0), ${MT} (15.0))";
  local_2c8 = &DAT_100000001;
  puStack_2c0 = (undefined1 *)0x100000004;
  local_2b8 = 0x41700000;
  local_2b0 = "mix";
  local_2a8 = "mix(${T} (10.0), ${T} (20.0), ${MT}(0.75))";
  local_2a0 = &DAT_100000001;
  puStack_298 = (undefined1 *)0x100000004;
  local_290 = 0x418c0000;
  local_288 = "step";
  local_280 = "step(${MT} (3.2), ${T} (4.2))";
  local_278 = &DAT_100000001;
  puStack_270 = (undefined1 *)0x100000004;
  local_268 = 0x3f800000;
  local_260 = "smoothstep";
  local_258 = "smoothstep(${MT} (3.0), ${MT} (5.0), ${T} (4.0))";
  local_250 = &DAT_100000001;
  puStack_248 = (undefined1 *)0x100000004;
  local_240 = 0x3f000000;
  addChildGroup(this,"common","Common",(TestParams *)local_418,0xc);
  local_418._0_8_ = "length_float";
  local_418._8_8_ = "length(1.0)";
  local_418._16_8_ = &DAT_100000001;
  puStack_400 = &DAT_100000001;
  local_3f8 = 1.0;
  local_3f0 = "length_vec2";
  local_3e8 = "length(vec2(1.0))";
  local_3e0 = &DAT_100000001;
  puStack_3d8 = &DAT_100000001;
  local_3d0 = 0x3fb504f3;
  local_3c8 = "length_vec3";
  local_3c0 = "length(vec3(1.0))";
  local_3b8 = &DAT_100000001;
  puStack_3b0 = &DAT_100000001;
  local_3a8 = 0x3fddb3d7;
  local_3a0 = "length_vec4";
  local_398 = "length(vec4(1.0))";
  local_390 = &DAT_100000001;
  puStack_388 = &DAT_100000001;
  local_380 = 0x40000000;
  local_378 = "distance_float";
  local_370 = "distance(1.0, 2.0)";
  local_368 = &DAT_100000001;
  puStack_360 = &DAT_100000001;
  local_358 = 0x3f800000;
  local_350 = "distance_vec2";
  local_348 = "distance(vec2(1.0), vec2(2.0))";
  local_340 = &DAT_100000001;
  puStack_338 = &DAT_100000001;
  local_330 = 0x3fb504f3;
  local_328 = "distance_vec3";
  local_320 = "distance(vec3(1.0), vec3(2.0))";
  local_318 = &DAT_100000001;
  puStack_310 = &DAT_100000001;
  local_308 = 0x3fddb3d7;
  local_300 = "distance_vec4";
  local_2f8 = "distance(vec4(1.0), vec4(2.0))";
  local_2f0 = &DAT_100000001;
  puStack_2e8 = &DAT_100000001;
  local_2e0 = 0x40000000;
  local_2d8 = "dot_float";
  local_2d0 = "dot(1.0, 1.0)";
  local_2c8 = &DAT_100000001;
  puStack_2c0 = &DAT_100000001;
  local_2b8 = 0x3f800000;
  local_2b0 = "dot_vec2";
  local_2a8 = "dot(vec2(1.0), vec2(1.0))";
  local_2a0 = &DAT_100000001;
  puStack_298 = &DAT_100000001;
  local_290 = 0x40000000;
  local_288 = "dot_vec3";
  local_280 = "dot(vec3(1.0), vec3(1.0))";
  local_278 = &DAT_100000001;
  puStack_270 = &DAT_100000001;
  local_268 = 0x40400000;
  local_260 = "dot_vec4";
  local_258 = "dot(vec4(1.0), vec4(1.0))";
  local_250 = &DAT_100000001;
  puStack_248 = &DAT_100000001;
  local_240 = 0x40800000;
  local_238 = "normalize_float";
  local_230 = "normalize(1.0)";
  local_228 = &DAT_100000001;
  puStack_220 = &DAT_100000001;
  local_218 = 0x3f800000;
  local_210 = "normalize_vec2";
  local_208 = "normalize(vec2(1.0)).x";
  local_200 = &DAT_100000001;
  puStack_1f8 = &DAT_100000001;
  local_1f0 = 0x3f3504f3;
  local_1e8 = "normalize_vec3";
  local_1e0 = "normalize(vec3(1.0)).x";
  local_1d8 = &DAT_100000001;
  puStack_1d0 = &DAT_100000001;
  local_1c8 = 0x3f13cd3a;
  local_1c0 = "normalize_vec4";
  local_1b8 = "normalize(vec4(1.0)).x";
  local_1b0 = &DAT_100000001;
  puStack_1a8 = &DAT_100000001;
  local_1a0 = 0x3f000000;
  local_198 = "faceforward";
  local_190 = "faceforward(${T} (1.0), ${T} (1.0), ${T} (1.0))";
  local_188 = &DAT_100000001;
  uStack_180 = 0x100000004;
  local_178 = 0xbf800000;
  local_170 = "reflect_float";
  local_168 = "reflect(1.0, 1.0)";
  local_160 = &DAT_100000001;
  puStack_158 = &DAT_100000001;
  local_150 = 0xbf800000;
  local_148 = "reflect_vec2";
  local_140 = "reflect(vec2(1.0), vec2(1.0, 0.0)).x";
  local_138 = &DAT_100000001;
  puStack_130 = &DAT_100000001;
  local_128 = 0xbf800000;
  local_120 = "reflect_vec3";
  local_118 = "reflect(vec3(1.0), vec3(1.0, 0.0, 0.0)).x";
  local_110 = &DAT_100000001;
  puStack_108 = &DAT_100000001;
  local_100 = 0xbf800000;
  local_f8 = "reflect_vec4";
  local_f0 = "reflect(vec4(1.0), vec4(1.0, 0.0, 0.0, 0.0)).x";
  local_e8 = &DAT_100000001;
  puStack_e0 = &DAT_100000001;
  local_d8 = 0xbf800000;
  local_d0 = "refract_float";
  local_c8 = "refract(1.0, 1.0, 0.5)";
  local_c0 = &DAT_100000001;
  puStack_b8 = &DAT_100000001;
  local_b0 = 0xbf800000;
  local_a8 = "refract_vec2";
  local_a0 = "refract(vec2(1.0), vec2(1.0, 0.0), 0.5).x";
  local_98 = &DAT_100000001;
  puStack_90 = &DAT_100000001;
  local_88 = 0xbf800000;
  local_80 = "refract_vec3";
  local_78 = "refract(vec3(1.0), vec3(1.0, 0.0, 0.0), 0.5).x";
  local_70 = &DAT_100000001;
  puStack_68 = &DAT_100000001;
  local_60 = 0xbf800000;
  local_58 = "refract_vec4";
  local_50 = "refract(vec4(1.0), vec4(1.0, 0.0, 0.0, 0.0), 0.5).x";
  local_48 = &DAT_100000001;
  puStack_40 = &DAT_100000001;
  local_38 = 0xbf800000;
  addChildGroup(this,"geometric","Geometric",(TestParams *)local_418,0x19);
  ppuVar2 = &PTR_anon_var_dwarf_1baef78_02129fc0;
  puVar3 = (undefined8 *)local_418;
  for (lVar1 = 0xf; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *ppuVar2;
    ppuVar2 = ppuVar2 + (ulong)bVar4 * -2 + 1;
    puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
  }
  addChildGroup(this,"matrix","Matrix",(TestParams *)local_418,3);
  memcpy(local_418,&PTR_anon_var_dwarf_3c1d61_0212a040,0x348);
  addChildGroup(this,"vector_relational","Vector relational",(TestParams *)local_418,0x15);
  return extraout_EAX;
}

Assistant:

void ShaderConstExprBuiltinTests::init (void)
{
	using namespace gls::ShaderConstExpr;

	// ${T} => final type, ${MT} => final type but with scalar version usable even when T is a vector

	// Trigonometry
	{
		const TestParams cases[] =
		{
			{"radians",			"radians(${T} (90.0))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatRadians(90.0f)		},
			{"degrees",			"degrees(${T} (2.0))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatDegrees(2.0f)		},
			{"sin",				"sin(${T} (3.0))",										glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatSin(3.0f)			},
			{"cos",				"cos(${T} (3.2))",										glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatCos(3.2f)			},
			{"tan",				"tan(${T} (1.5))",										glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatTan(1.5f)			},
			{"asin",			"asin(${T} (0.0))",										glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatAsin(0.0f)			},
			{"acos",			"acos(${T} (1.0))",										glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatAcos(1.0f)			},
			{"atan_separate",	"atan(${T} (-1.0), ${T} (-1.0))",						glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatAtan2(-1.0f, -1.0f)	},
			{"atan_combined",	"atan(${T} (2.0))",										glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatAtanOver(2.0f)		},
		};

		addChildGroup("trigonometry", "Trigonometry", cases, DE_LENGTH_OF_ARRAY(cases));
	}
	// Exponential
	{
		const TestParams cases[] =
		{
			{"pow",				"pow(${T} (1.7), ${T} (3.5))",							glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatPow(1.7f, 3.5f)		},
			{"exp",				"exp(${T} (4.2))",										glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatExp(4.2f)			},
			{"log",				"log(${T} (42.12))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatLog(42.12f)			},
			{"exp2",			"exp2(${T} (6.7))",										glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatExp2(6.7f)			},
			{"log2",			"log2(${T} (100.0))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatLog2(100.0f)			},
			{"sqrt",			"sqrt(${T} (10.0))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatSqrt(10.0f)			},
			{"inversesqrt",		"inversesqrt(${T} (10.0))",								glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatRsq(10.0f)			},
		};

		addChildGroup("exponential", "Exponential", cases, DE_LENGTH_OF_ARRAY(cases));
	}
	// Common
	{
		const TestParams cases[] =
		{
			{"abs",				"abs(${T} (-42.0))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, 42.0f						},
			{"sign",			"sign(${T} (-18.0))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, -1.0f						},
			{"floor",			"floor(${T} (37.3))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatFloor(37.3f)			},
			{"ceil",			"ceil(${T} (82.2))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatCeil(82.2f)			},
			{"fract",			"fract(${T} (17.75))",									glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatFrac(17.75f)			},
			{"mod",				"mod(${T} (87.65), ${MT} (3.7))",						glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, deFloatMod(87.65f, 3.7f)	},
			{"min",				"min(${T} (12.3), ${MT} (32.1))",						glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, 12.3f						},
			{"max",				"max(${T} (12.3), ${MT} (32.1))",						glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, 32.1f						},
			{"clamp",			"clamp(${T} (42.1),	${MT} (10.0), ${MT} (15.0))",		glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, 15.0f						},
			{"mix",				"mix(${T} (10.0), ${T} (20.0), ${MT}(0.75))",			glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, 17.5f						},
			{"step",			"step(${MT} (3.2), ${T} (4.2))",						glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, 1.0f						},
			{"smoothstep",		"smoothstep(${MT} (3.0), ${MT} (5.0), ${T} (4.0))",		glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, 0.5f						},
		};

		addChildGroup("common", "Common", cases, DE_LENGTH_OF_ARRAY(cases));
	}
	// Geometric
	{
		const TestParams cases[] =
		{
			{"length_float",	"length(1.0)",											glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 1.0f						},
			{"length_vec2",		"length(vec2(1.0))",									glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, deFloatSqrt(2.0f)			},
			{"length_vec3",		"length(vec3(1.0))",									glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, deFloatSqrt(3.0f)			},
			{"length_vec4",		"length(vec4(1.0))",									glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, deFloatSqrt(4.0f)			},

			{"distance_float",	"distance(1.0, 2.0)",									glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 1.0f						},
			{"distance_vec2",	"distance(vec2(1.0), vec2(2.0))",						glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, deFloatSqrt(2.0f)			},
			{"distance_vec3",	"distance(vec3(1.0), vec3(2.0))",						glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, deFloatSqrt(3.0f)			},
			{"distance_vec4",	"distance(vec4(1.0), vec4(2.0))",						glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, deFloatSqrt(4.0f)			},

			{"dot_float",		"dot(1.0, 1.0)",										glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 1.0f						},
			{"dot_vec2",		"dot(vec2(1.0), vec2(1.0))",							glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 2.0f						},
			{"dot_vec3",		"dot(vec3(1.0), vec3(1.0))",							glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 3.0f						},
			{"dot_vec4",		"dot(vec4(1.0), vec4(1.0))",							glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 4.0f						},

			{"normalize_float",	"normalize(1.0)",										glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 1.0f						},
			{"normalize_vec2",	"normalize(vec2(1.0)).x",								glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, deFloatRsq(2.0f)			},
			{"normalize_vec3",	"normalize(vec3(1.0)).x",								glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, deFloatRsq(3.0f)			},
			{"normalize_vec4",	"normalize(vec4(1.0)).x",								glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, deFloatRsq(4.0f)			},

			{"faceforward",		"faceforward(${T} (1.0), ${T} (1.0), ${T} (1.0))",		glu::TYPE_FLOAT, 1, 4, glu::TYPE_FLOAT, -1.0f						},

			// reflect(I, N) => I - 2*dot(N, I)*N
			{"reflect_float",	"reflect(1.0, 1.0)",									glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, -1.0f						},
			{"reflect_vec2",	"reflect(vec2(1.0), vec2(1.0, 0.0)).x",					glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, -1.0f						},
			{"reflect_vec3",	"reflect(vec3(1.0), vec3(1.0, 0.0, 0.0)).x",			glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, -1.0f						},
			{"reflect_vec4",	"reflect(vec4(1.0), vec4(1.0, 0.0, 0.0, 0.0)).x",		glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, -1.0f						},

			/*
			genType refract(genType I, genType N, float eta) =>
				k = 1.0 - (eta^2)*(1.0-dot(N,I)^2)
				if k < 0 return 0.0
				else return eta*I - (eta*dot(N,I) + sqrt(k))*N
			*/
			{"refract_float",	"refract(1.0, 1.0, 0.5)",								glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, -1.0f						},
			{"refract_vec2",	"refract(vec2(1.0), vec2(1.0, 0.0), 0.5).x",			glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, -1.0f						},
			{"refract_vec3",	"refract(vec3(1.0), vec3(1.0, 0.0, 0.0), 0.5).x",		glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, -1.0f						},
			{"refract_vec4",	"refract(vec4(1.0), vec4(1.0, 0.0, 0.0, 0.0), 0.5).x",	glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, -1.0f						},
		};

		addChildGroup("geometric", "Geometric", cases, DE_LENGTH_OF_ARRAY(cases));
	}
	// Matrix
	{
		const TestParams cases[] =
		{
			{"compMult_mat2",	"matrixCompMult(mat2(1.0), mat2(1.0))[0][0]",			glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 1.0f						},
			{"compMult_mat3",	"matrixCompMult(mat3(1.0), mat3(1.0))[0][0]",			glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 1.0f						},
			{"compMult_mat4",	"matrixCompMult(mat4(1.0), mat4(1.0))[0][0]",			glu::TYPE_FLOAT, 1, 1, glu::TYPE_FLOAT, 1.0f						},
		};

		addChildGroup("matrix", "Matrix", cases, DE_LENGTH_OF_ARRAY(cases));
	}
	// Vector relational
	{
		const TestParams cases[] =
		{
			{"lessThan",		"lessThan(${T} (1.0), ${T} (2.0))",						glu::TYPE_FLOAT, 2, 4, glu::TYPE_BOOL,  1.0f						},
			{"lessThan",		"lessThan(${T} (1), ${T} (2))",							glu::TYPE_INT,   2, 4, glu::TYPE_BOOL,  1.0f						},
			{"lessThanEqual",	"lessThanEqual(${T} (1.0), ${T} (1.0))",				glu::TYPE_FLOAT, 2, 4, glu::TYPE_BOOL,  1.0f						},
			{"lessThanEqual",	"lessThanEqual(${T} (1), ${T} (1))",					glu::TYPE_INT,   2, 4, glu::TYPE_BOOL,  1.0f						},
			{"greaterThan",		"greaterThan(${T} (1.0), ${T} (2.0))",					glu::TYPE_FLOAT, 2, 4, glu::TYPE_BOOL,  0.0f						},
			{"greaterThan",		"greaterThan(${T} (1), ${T} (2))",						glu::TYPE_INT,   2, 4, glu::TYPE_BOOL,  0.0f						},
			{"greaterThanEqual","greaterThanEqual(${T} (1.0), ${T} (2.0))",				glu::TYPE_FLOAT, 2, 4, glu::TYPE_BOOL,  0.0f						},
			{"greaterThanEqual","greaterThanEqual(${T} (1), ${T} (2))",					glu::TYPE_INT,   2, 4, glu::TYPE_BOOL,  0.0f						},
			{"equal",			"equal(${T} (1.0), ${T} (1.2))",						glu::TYPE_FLOAT, 2, 4, glu::TYPE_BOOL,  0.0f						},
			{"equal",			"equal(${T} (1), ${T} (2))",							glu::TYPE_INT,   2, 4, glu::TYPE_BOOL,  0.0f						},
			{"equal",			"equal(${T} (true), ${T} (false))",						glu::TYPE_BOOL,  2, 4, glu::TYPE_BOOL,  0.0f						},
			{"notEqual",		"notEqual(${T} (1.0), ${T} (1.2))",						glu::TYPE_FLOAT, 2, 4, glu::TYPE_BOOL,  1.0f						},
			{"notEqual",		"notEqual(${T} (1), ${T} (2))",							glu::TYPE_INT,   2, 4, glu::TYPE_BOOL,  1.0f						},
			{"notEqual",		"notEqual(${T} (true), ${T} (false))",					glu::TYPE_BOOL,  2, 4, glu::TYPE_BOOL,  1.0f						},
			{"any_bvec2",		"any(bvec2(true, false))",								glu::TYPE_BOOL,  1, 1, glu::TYPE_BOOL,  1.0f						},
			{"any_bvec3",		"any(bvec3(true, false, false))",						glu::TYPE_BOOL,  1, 1, glu::TYPE_BOOL,  1.0f						},
			{"any_bvec4",		"any(bvec4(true, false, false, false))",				glu::TYPE_BOOL,  1, 1, glu::TYPE_BOOL,  1.0f						},
			{"all_bvec2",		"all(bvec2(true, false))",								glu::TYPE_BOOL,  1, 1, glu::TYPE_BOOL,  0.0f						},
			{"all_bvec3",		"all(bvec3(true, false, false))",						glu::TYPE_BOOL,  1, 1, glu::TYPE_BOOL,  0.0f						},
			{"all_bvec4",		"all(bvec4(true, false, false, false))",				glu::TYPE_BOOL,  1, 1, glu::TYPE_BOOL,  0.0f						},
			{"not",				"not(${T} (false))",									glu::TYPE_BOOL,  2, 4, glu::TYPE_BOOL,  1.0f						}
		};

		addChildGroup("vector_relational", "Vector relational", cases, DE_LENGTH_OF_ARRAY(cases));
	}
}